

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

void google::protobuf::internal::GenericSwap(Message *lhs,Message *rhs)

{
  ulong uVar1;
  int iVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  undefined8 *puVar6;
  Reflection *this;
  Message *pMVar7;
  Message *pMVar8;
  LogFinisher local_51;
  LogMessage local_50;
  Message *message1;
  
  uVar4 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 2) == 0) {
    puVar5 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
  }
  else {
    puVar5 = (undefined8 *)0x0;
  }
  uVar1 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 2) == 0) {
    puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar6 = (undefined8 *)*puVar6;
    }
  }
  else {
    puVar6 = (undefined8 *)0x0;
  }
  if (puVar5 == puVar6) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x1a8);
    pLVar3 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: Arena::InternalHelper<Message>::GetOwningArena(lhs) != Arena::InternalHelper<Message>::GetOwningArena(rhs): "
                       );
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
    uVar4 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  }
  if ((uVar4 & 2) == 0) {
    puVar5 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    if (puVar5 == (undefined8 *)0x0) goto LAB_003acedc;
  }
  else {
LAB_003acedc:
    uVar4 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar4 & 2) == 0) {
      puVar5 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        puVar5 = (undefined8 *)*puVar5;
      }
      if (puVar5 != (undefined8 *)0x0) goto LAB_003acf3c;
    }
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x1aa);
    pLVar3 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: Arena::InternalHelper<Message>::GetOwningArena(lhs) != nullptr || Arena::InternalHelper<Message>::GetOwningArena(rhs) != nullptr: "
                       );
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
LAB_003acf3c:
  uVar4 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 2) == 0) {
    puVar5 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    pMVar7 = rhs;
    pMVar8 = lhs;
    if (puVar5 != (undefined8 *)0x0) goto LAB_003acf7f;
  }
  uVar4 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  pMVar7 = lhs;
  pMVar8 = rhs;
  if ((uVar4 & 2) == 0) {
    puVar5 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
  }
  else {
    puVar5 = (undefined8 *)0x0;
  }
LAB_003acf7f:
  iVar2 = (*(pMVar7->super_MessageLite)._vptr_MessageLite[3])(pMVar7,puVar5);
  message1 = (Message *)CONCAT44(extraout_var,iVar2);
  (*(message1->super_MessageLite)._vptr_MessageLite[7])(message1,pMVar8);
  (*(pMVar8->super_MessageLite)._vptr_MessageLite[4])(pMVar8);
  (*(pMVar8->super_MessageLite)._vptr_MessageLite[7])(pMVar8,pMVar7);
  (*(pMVar7->super_MessageLite)._vptr_MessageLite[0x11])(pMVar7);
  Reflection::Swap(this,message1,pMVar7);
  return;
}

Assistant:

void GenericSwap(Message* lhs, Message* rhs) {
#ifndef PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(Arena::InternalHelper<Message>::GetOwningArena(lhs) !=
         Arena::InternalHelper<Message>::GetOwningArena(rhs));
  GOOGLE_DCHECK(Arena::InternalHelper<Message>::GetOwningArena(lhs) != nullptr ||
         Arena::InternalHelper<Message>::GetOwningArena(rhs) != nullptr);
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP
  // At least one of these must have an arena, so make `rhs` point to it.
  Arena* arena = Arena::InternalHelper<Message>::GetOwningArena(rhs);
  if (arena == nullptr) {
    std::swap(lhs, rhs);
    arena = Arena::InternalHelper<Message>::GetOwningArena(rhs);
  }

  // Improve efficiency by placing the temporary on an arena so that messages
  // are copied twice rather than three times.
  Message* tmp = rhs->New(arena);
  tmp->CheckTypeAndMergeFrom(*lhs);
  lhs->Clear();
  lhs->CheckTypeAndMergeFrom(*rhs);
#ifdef PROTOBUF_FORCE_COPY_IN_SWAP
  rhs->Clear();
  rhs->CheckTypeAndMergeFrom(*tmp);
  if (arena == nullptr) delete tmp;
#else   // PROTOBUF_FORCE_COPY_IN_SWAP
  rhs->GetReflection()->Swap(tmp, rhs);
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP
}